

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,int viewOk)

{
  sqlite3 *db;
  uint uVar1;
  VTable *pVVar2;
  char *pcVar3;
  char *zFormat;
  
  if (pTab->eTabType == '\x01') {
    db = pParse->db;
    pVVar2 = sqlite3GetVTable(db,pTab);
    if (pVVar2->pMod->pModule->xUpdate ==
        (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0) {
LAB_001b13dc:
      pcVar3 = pTab->zName;
      zFormat = "table %s may not be modified";
      goto LAB_001b13ff;
    }
    if ((pParse->pToplevel != (Parse *)0x0) &&
       (((uint)db->flags >> 7 & 1) < (uint)((pTab->u).vtab.p)->eVtabRisk)) {
      sqlite3ErrorMsg(pParse,"unsafe use of virtual table \"%s\"",pTab->zName);
    }
  }
  else if ((pTab->tabFlags & 0x1001) != 0) {
    if ((pTab->tabFlags & 1) == 0) {
      uVar1 = sqlite3ReadOnlyShadowTables(pParse->db);
    }
    else {
      if ((pParse->db->flags & 0x10000001) == 1) goto LAB_001b13e8;
      uVar1 = (uint)(pParse->nested == '\0');
    }
    if (uVar1 != 0) goto LAB_001b13dc;
  }
LAB_001b13e8:
  if (viewOk != 0) {
    return 0;
  }
  if (pTab->eTabType != '\x02') {
    return 0;
  }
  pcVar3 = pTab->zName;
  zFormat = "cannot modify %s because it is a view";
LAB_001b13ff:
  sqlite3ErrorMsg(pParse,zFormat,pcVar3);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, int viewOk){
  if( tabIsReadOnly(pParse, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }
#ifndef SQLITE_OMIT_VIEW
  if( !viewOk && IsView(pTab) ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}